

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_formatter
               (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  registry *this;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_18;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *local_10;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter_local;
  
  local_10 = formatter;
  this = details::registry::instance();
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::unique_ptr
            (&local_18,formatter);
  details::registry::set_formatter(this,&local_18);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

SPDLOG_INLINE void set_formatter(std::unique_ptr<spdlog::formatter> formatter)
{
    details::registry::instance().set_formatter(std::move(formatter));
}